

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O3

bool __thiscall
cppnet::TimerContainer::AddTimer
          (TimerContainer *this,weak_ptr<cppnet::TimerSlot> *t,uint32_t time,bool always)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  TimerSlot *this_01;
  element_type *peVar2;
  undefined1 uVar3;
  _Atomic_word _Var4;
  int iVar5;
  bool bVar6;
  shared_ptr<cppnet::TimerSlot> local_58;
  TimerSlot *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  
  if ((this->_timer_max <= time) ||
     (this_00 = (t->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi, this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    return false;
  }
  _Var4 = this_00->_M_use_count;
  do {
    if (_Var4 == 0) {
      return false;
    }
    LOCK();
    iVar5 = this_00->_M_use_count;
    bVar6 = _Var4 == iVar5;
    if (bVar6) {
      this_00->_M_use_count = _Var4 + 1;
      iVar5 = _Var4;
    }
    _Var4 = iVar5;
    UNLOCK();
  } while (!bVar6);
  this_01 = (t->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (this_01 != (TimerSlot *)0x0 && this_00->_M_use_count != 0) {
    if ((time < this->_time_unit) &&
       (peVar2 = (this->_sub_timer).
                 super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
       peVar2 != (element_type *)0x0)) {
      local_40 = (t->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                 _M_pi;
      if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_40->_M_weak_count = local_40->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          local_40->_M_weak_count = local_40->_M_weak_count + 1;
        }
      }
      local_48 = this_01;
      iVar5 = (**(peVar2->super_Timer)._vptr_Timer)(peVar2,&local_48,(ulong)time,(ulong)always);
      uVar3 = (undefined1)iVar5;
      if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &local_40->_M_weak_count;
          iVar5 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar5 = local_40->_M_weak_count;
          local_40->_M_weak_count = iVar5 + -1;
        }
        if (iVar5 == 1) {
          (*local_40->_vptr__Sp_counted_base[3])();
        }
      }
      goto LAB_0011326c;
    }
    bVar6 = TimerSlot::IsInTimer(this_01);
    if (!bVar6) {
      TimerSlot::SetInterval(this_01,time);
      TimerSlot::SetInTimer(this_01);
      if (always) {
        TimerSlot::SetAlways(this_01);
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      local_58.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
      local_58.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           this_00;
      uVar3 = InnerAddTimer(this,&local_58,time);
      if (local_58.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      goto LAB_0011326c;
    }
  }
  uVar3 = 0;
LAB_0011326c:
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return (bool)uVar3;
}

Assistant:

bool TimerContainer::AddTimer(std::weak_ptr<TimerSlot> t, uint32_t time, bool always) {
    if (time >= _timer_max) {
        return false;
    }

    auto ptr = t.lock();
    if (!ptr) {
        return false;
    }

    if (time < _time_unit && _sub_timer) {
        return _sub_timer->AddTimer(t, time, always);
    }

    // set current timer unit interval
    if (!ptr->IsInTimer()) {
        ptr->SetInterval(time);
        ptr->SetInTimer();
        if (always) {
            ptr->SetAlways();
        }

    } else {
        return false;
    }

    return InnerAddTimer(ptr, time);
}